

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_privkey.c
# Opt level: O2

err_t cmdPrivkeyRead(octet *privkey,size_t *privkey_len,char *name,cmd_pwd_t pwd)

{
  err_t eVar1;
  size_t sVar2;
  octet *epki;
  size_t pwd_len;
  ulong privkey_len_00;
  bool bVar3;
  size_t epki_len_max;
  size_t epki_len_min;
  size_t epki_len;
  octet *local_48;
  octet *local_40;
  char *local_38;
  
  if ((privkey_len == (size_t *)0x0) || (sVar2 = *privkey_len, sVar2 == 0)) {
    local_38 = name;
    sVar2 = cmdFileSize(name);
    if (sVar2 == 0xffffffffffffffff) {
      eVar1 = 0xcf;
    }
    else {
      privkey_len_00 = 0x18;
      epki_len = sVar2;
      local_48 = privkey;
      local_40 = (octet *)pwd;
      while (privkey_len_00 < 0x41) {
        eVar1 = bpkiPrivkeyWrap((octet *)0x0,&epki_len_min,(octet *)0x0,privkey_len_00,(octet *)0x0,
                                0,(octet *)0x0,10000);
        if (eVar1 != 0) {
          return eVar1;
        }
        eVar1 = bpkiPrivkeyWrap((octet *)0x0,&epki_len_max,(octet *)0x0,privkey_len_00,(octet *)0x0,
                                0,(octet *)0x0,0xffffffffffffffff);
        if (eVar1 != 0) {
          return eVar1;
        }
        if ((epki_len_min <= sVar2) && (sVar2 <= epki_len_max)) {
          name = local_38;
          pwd = (cmd_pwd_t)local_40;
          privkey = local_48;
          if (privkey_len != (size_t *)0x0) {
            *privkey_len = privkey_len_00;
          }
          goto LAB_00104c7b;
        }
        bVar3 = privkey_len_00 == 0x18;
        privkey_len_00 = privkey_len_00 + 0x10;
        if (bVar3) {
          privkey_len_00 = 0x20;
        }
      }
      eVar1 = 0x132;
    }
  }
  else {
    eVar1 = bpkiPrivkeyWrap((octet *)0x0,&epki_len_min,(octet *)0x0,sVar2,(octet *)0x0,0,
                            (octet *)0x0,10000);
    if ((eVar1 == 0) &&
       (eVar1 = bpkiPrivkeyWrap((octet *)0x0,&epki_len_max,(octet *)0x0,sVar2,(octet *)0x0,0,
                                (octet *)0x0,0xffffffffffffffff), eVar1 == 0)) {
LAB_00104c7b:
      if (privkey == (octet *)0x0) {
        eVar1 = 0;
      }
      else {
        epki = (octet *)blobCreate(epki_len_max + 1);
        if (epki == (octet *)0x0) {
          eVar1 = 0x6e;
        }
        else {
          eVar1 = cmdFileReadAll((void *)0x0,&epki_len,name);
          if ((((eVar1 == 0) && (eVar1 = 0x132, epki_len_min <= epki_len)) &&
              (epki_len <= epki_len_max)) &&
             (eVar1 = cmdFileReadAll(epki,&epki_len,name), sVar2 = epki_len, eVar1 == 0)) {
            pwd_len = strLen(pwd);
            eVar1 = bpkiPrivkeyUnwrap(privkey,&epki_len_min,epki,sVar2,(octet *)pwd,pwd_len);
          }
          blobClose(epki);
        }
      }
    }
  }
  return eVar1;
}

Assistant:

err_t cmdPrivkeyRead(octet privkey[], size_t* privkey_len, const char* name,
	const cmd_pwd_t pwd)
{
	err_t code;
	size_t len;
	size_t epki_len;
	size_t epki_len_min;
	size_t epki_len_max;
	void* stack;
	octet* epki;
	// pre
	ASSERT(memIsNullOrValid(privkey_len, sizeof(size_t)));
	ASSERT(!privkey_len || *privkey_len == 0 || *privkey_len == 24 ||
		*privkey_len == 32 || *privkey_len == 48 ||  *privkey_len == 64);
	ASSERT(strIsValid(name));
	ASSERT(cmdPwdIsValid(pwd));
	// определить длину личного ключа по размеру контейнера
	if (!privkey_len || *privkey_len == 0)
	{
		// определить размер контейнера
		if ((epki_len = cmdFileSize(name)) == SIZE_MAX)
			return ERR_FILE_READ;
		// найти подходящую длину
		for (len = 24; len <= 64; len = len == 24 ? len + 8 : len + 16)
		{
			code = bpkiPrivkeyWrap(0, &epki_len_min, 0, len, 0, 0, 0, 10000);
			ERR_CALL_CHECK(code);
			code = bpkiPrivkeyWrap(0, &epki_len_max, 0, len, 0, 0, 0, SIZE_MAX);
			ERR_CALL_CHECK(code);
			if (epki_len_min <= epki_len && epki_len <= epki_len_max)
				break;
		}
		if (len > 64)
			return ERR_BAD_FORMAT;
		if (privkey_len)
			*privkey_len = len;
	}
	// обработать переданную длину личного ключа
	else
	{
		len = *privkey_len;
		code = bpkiPrivkeyWrap(0, &epki_len_min, 0, len, 0, 0, 0, 10000);
		ERR_CALL_CHECK(code);
		code = bpkiPrivkeyWrap(0, &epki_len_max, 0, len, 0, 0, 0, SIZE_MAX);
		ERR_CALL_CHECK(code);
	}
	// ключ определять не нужно?
	if (!privkey)
		return ERR_OK;
	ASSERT(len == 24 || len == 32 || len == 48 || len == 64);
	ASSERT(memIsValid(privkey, len));
	// выделить память и разметить ее
	code = cmdBlobCreate(stack, epki_len_max + 1);
	ERR_CALL_CHECK(code);
	epki = (octet*)stack;
	// определить длину контейнера
	code = cmdFileReadAll(0, &epki_len, name);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// проверить длину
	code = (epki_len_min <= epki_len && epki_len <= epki_len_max) ?
		ERR_OK : ERR_BAD_FORMAT;
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// читать
	code = cmdFileReadAll(epki, &epki_len, name);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// снять защиту
	code = bpkiPrivkeyUnwrap(privkey, &epki_len_min, epki, epki_len,
		(const octet*)pwd, cmdPwdLen(pwd));
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	ASSERT(epki_len_min == len);
	cmdBlobClose(stack);
	return code;
}